

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_sockaddr_cmp(sockaddr *sa1,sockaddr *sa2,int include_port)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = sa1->sa_family;
  iVar4 = (uint)uVar1 - (uint)sa2->sa_family;
  if (iVar4 != 0) {
    return iVar4;
  }
  if (uVar1 != 10) {
    if (uVar1 != 2) {
      return 1;
    }
    uVar5 = *(uint *)(sa2->sa_data + 2);
    uVar2 = *(uint *)(sa1->sa_data + 2);
    if (uVar2 < uVar5) {
      return -1;
    }
    if (uVar2 >= uVar5 && uVar2 != uVar5) {
      return 1;
    }
    goto LAB_001e6c5c;
  }
  uVar7 = *(ulong *)(sa1->sa_data + 6);
  uVar6 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
          (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
          (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
  uVar7 = *(ulong *)(sa2->sa_data + 6);
  uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
          (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
          (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
  if (uVar6 == uVar7) {
    uVar7._0_2_ = sa1[1].sa_family;
    uVar7._2_1_ = sa1[1].sa_data[0];
    uVar7._3_1_ = sa1[1].sa_data[1];
    uVar7._4_1_ = sa1[1].sa_data[2];
    uVar7._5_1_ = sa1[1].sa_data[3];
    uVar7._6_1_ = sa1[1].sa_data[4];
    uVar7._7_1_ = sa1[1].sa_data[5];
    uVar3._0_2_ = sa2[1].sa_family;
    uVar3._2_1_ = sa2[1].sa_data[0];
    uVar3._3_1_ = sa2[1].sa_data[1];
    uVar3._4_1_ = sa2[1].sa_data[2];
    uVar3._5_1_ = sa2[1].sa_data[3];
    uVar3._6_1_ = sa2[1].sa_data[4];
    uVar3._7_1_ = sa2[1].sa_data[5];
    uVar6 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    uVar7 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar5 = 0;
    if (uVar6 != uVar7) goto LAB_001e6c4e;
  }
  else {
LAB_001e6c4e:
    uVar5 = -(uint)(uVar6 < uVar7) | 1;
  }
  if (uVar5 != 0) {
    return uVar5;
  }
LAB_001e6c5c:
  if ((include_port != 0) &&
     (iVar4 = (uint)*(ushort *)sa1->sa_data - (uint)*(ushort *)sa2->sa_data, iVar4 != 0)) {
    return iVar4;
  }
  return 0;
}

Assistant:

int
evutil_sockaddr_cmp(const struct sockaddr *sa1, const struct sockaddr *sa2,
    int include_port)
{
	int r;
	if (0 != (r = (sa1->sa_family - sa2->sa_family)))
		return r;

	if (sa1->sa_family == AF_INET) {
		const struct sockaddr_in *sin1, *sin2;
		sin1 = (const struct sockaddr_in *)sa1;
		sin2 = (const struct sockaddr_in *)sa2;
		if (sin1->sin_addr.s_addr < sin2->sin_addr.s_addr)
			return -1;
		else if (sin1->sin_addr.s_addr > sin2->sin_addr.s_addr)
			return 1;
		else if (include_port &&
		    (r = ((int)sin1->sin_port - (int)sin2->sin_port)))
			return r;
		else
			return 0;
	}
#ifdef AF_INET6
	else if (sa1->sa_family == AF_INET6) {
		const struct sockaddr_in6 *sin1, *sin2;
		sin1 = (const struct sockaddr_in6 *)sa1;
		sin2 = (const struct sockaddr_in6 *)sa2;
		if ((r = memcmp(sin1->sin6_addr.s6_addr, sin2->sin6_addr.s6_addr, 16)))
			return r;
		else if (include_port &&
		    (r = ((int)sin1->sin6_port - (int)sin2->sin6_port)))
			return r;
		else
			return 0;
	}
#endif
	return 1;
}